

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O0

bool __thiscall
llbuild::buildsystem::ShellCommand::configureAttribute
          (ShellCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  StringRef value_00;
  StringRef name_00;
  StringRef S;
  ConfigureContext *pCVar1;
  ShellCommand *pSVar2;
  char *pcVar3;
  size_t __s1;
  int iVar4;
  BuildFileDelegate *pBVar5;
  undefined8 uVar6;
  undefined4 extraout_var;
  size_t sVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar8;
  bool bVar9;
  bool bVar10;
  error_code eVar11;
  bool local_23f1;
  bool local_2341;
  bool local_22b1;
  bool local_2119;
  Twine local_20c0;
  Twine local_20a8;
  Twine local_2090;
  Twine local_2078;
  Twine local_2060;
  Twine local_2048;
  Twine local_2030;
  char *local_2018;
  ShellCommand *local_2008;
  char *local_2000;
  char *local_1ff8;
  ShellCommand *local_1fe8;
  char *local_1fe0;
  char *local_1fd8;
  void *local_1fc8;
  size_t local_1fc0;
  StringRef local_1fb8;
  string local_1fa8;
  int local_1f88;
  error_category *local_1f80;
  ShellCommand *local_1f78;
  char *local_1f70;
  undefined1 local_1f68 [8];
  SmallString<4096U> wd;
  Twine local_f18;
  Twine local_f00;
  Twine local_ee8;
  Twine local_ed0;
  Twine local_eb8;
  Twine local_ea0;
  Twine local_e88;
  char *local_e70;
  ShellCommand *local_e60;
  char *local_e58;
  char *local_e50;
  ShellCommand *local_e40;
  char *local_e38;
  char *local_e30;
  void *local_e20;
  size_t local_e18;
  char *local_e10;
  ShellCommand *local_e00;
  char *local_df8;
  Twine local_df0;
  Twine local_dd8;
  Twine local_dc0;
  Twine local_da8;
  Twine local_d90;
  Twine local_d78;
  Twine local_d60;
  char *local_d48;
  ShellCommand *local_d38;
  char *local_d30;
  char *local_d28;
  ShellCommand *local_d18;
  char *local_d10;
  char *local_d08;
  void *local_cf8;
  size_t local_cf0;
  Twine local_ce8;
  Twine local_cd0;
  Twine local_cb8;
  char *local_ca0;
  ShellCommand *local_c90;
  char *local_c88;
  char *local_c80;
  ShellCommand *local_c70;
  char *local_c68;
  char *local_c60;
  ShellCommand *local_c50;
  char *local_c48;
  char *local_c40;
  void *local_c30;
  size_t local_c28;
  char *local_c20;
  void *local_c10;
  size_t local_c08;
  string local_c00;
  char *local_be0;
  void *local_bd0;
  size_t local_bc8;
  ShellCommand *local_bc0;
  char *local_bb8;
  value_type local_bb0;
  char *local_ba0;
  value_type local_b90;
  undefined8 local_b80;
  value_type local_b70;
  char *local_b60;
  char *local_b50;
  size_t local_b48;
  ConfigureContext *local_b40;
  ConfigureContext *ctx_local;
  ShellCommand *this_local;
  StringRef value_local;
  StringRef name_local;
  ShellCommand *local_988;
  char *local_980;
  char *local_978;
  size_t local_970;
  char *local_968;
  size_t local_960;
  void *local_958;
  size_t local_950;
  AlignedCharArrayUnion<char,_char,_char,_char,_char,_char,_char,_char,_char,_char> local_948 [8];
  size_t local_940;
  AlignedCharArrayUnion<char,_char,_char,_char,_char,_char,_char,_char,_char,_char> local_938 [8];
  size_t local_930;
  size_t local_928;
  size_t local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  ShellCommand *local_8f8;
  char *local_8f0;
  char *local_8e8;
  size_t local_8e0;
  char *local_8d8;
  size_t local_8d0;
  void *local_8c8;
  size_t local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  ShellCommand *local_898;
  char *local_890;
  char *local_888;
  size_t local_880;
  char *local_878;
  size_t local_870;
  void *local_868;
  size_t local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  ShellCommand *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  ShellCommand *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  ShellCommand *local_7d8;
  char *local_7d0;
  char *local_7c8;
  size_t local_7c0;
  char *local_7b8;
  size_t local_7b0;
  void *local_7a8;
  size_t local_7a0;
  char *local_798;
  size_t local_790;
  char *local_788;
  size_t local_780;
  void *local_778;
  size_t local_770;
  char *local_768;
  size_t local_760;
  char *local_758;
  size_t local_750;
  void *local_748;
  size_t local_740;
  char *local_738;
  size_t local_730;
  char *local_728;
  size_t local_720;
  char *local_718;
  size_t local_710;
  char *local_708;
  char *local_700;
  ShellCommand *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  ShellCommand *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  ShellCommand *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  ShellCommand *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  ShellCommand *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  ShellCommand *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  ShellCommand *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  ShellCommand *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  ShellCommand *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  ShellCommand *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  ShellCommand *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  ShellCommand *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  ShellCommand *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  ShellCommand *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  ShellCommand *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  ShellCommand *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  ShellCommand *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  ShellCommand *local_478;
  char *local_470;
  ShellCommand **local_468;
  char *local_460;
  char *local_458;
  ShellCommand **local_450;
  char *local_448;
  char *local_440;
  ShellCommand **local_438;
  char *local_430;
  char *local_428;
  ShellCommand **local_420;
  char *local_418;
  char *local_410;
  ShellCommand **local_408;
  char *local_400;
  char *local_3f8;
  ShellCommand **local_3f0;
  char *local_3e8;
  char *local_3e0;
  char **local_3d8;
  char *local_3d0;
  size_t local_3c8;
  void **local_3c0;
  char *local_3b8;
  size_t local_3b0;
  void **local_3a8;
  char *local_3a0;
  size_t local_398;
  void **local_390;
  char *local_388;
  size_t local_380;
  ShellCommand **local_378;
  char *local_370;
  char *local_368;
  ShellCommand **local_360;
  char *local_358;
  char *local_350;
  ShellCommand **local_348;
  char *local_340;
  char *local_338;
  void **local_330;
  char *local_328;
  size_t local_320;
  ShellCommand **local_318;
  char *local_310;
  char *local_308;
  void **local_300;
  char *local_2f8;
  size_t local_2f0;
  ShellCommand **local_2e8;
  char *local_2e0;
  char *local_2d8;
  size_t *local_2d0;
  AlignedCharArrayUnion<char,_char,_char,_char,_char,_char,_char,_char,_char,_char> local_2c8 [8];
  size_t local_2c0;
  void **local_2b8;
  char *local_2b0;
  size_t local_2a8;
  ShellCommand **local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  ShellCommand *local_278;
  int local_26c;
  size_t local_268;
  char *local_260;
  void *local_258;
  int local_24c;
  size_t local_248;
  AlignedCharArrayUnion<char,_char,_char,_char,_char,_char,_char,_char,_char,_char> local_240 [8];
  size_t local_238;
  int local_22c;
  char *local_228;
  char *local_220;
  ShellCommand *local_218;
  int local_20c;
  size_t local_208;
  char *local_200;
  void *local_1f8;
  int local_1ec;
  char *local_1e8;
  char *local_1e0;
  ShellCommand *local_1d8;
  int local_1cc;
  size_t local_1c8;
  char *local_1c0;
  void *local_1b8;
  int local_1ac;
  char *local_1a8;
  char *local_1a0;
  ShellCommand *local_198;
  int local_18c;
  char *local_188;
  char *local_180;
  ShellCommand *local_178;
  int local_16c;
  char *local_168;
  char *local_160;
  ShellCommand *local_158;
  int local_14c;
  size_t local_148;
  char *local_140;
  void *local_138;
  int local_12c;
  size_t local_128;
  char *local_120;
  void *local_118;
  int local_10c;
  size_t local_108;
  char *local_100;
  void *local_f8;
  int local_ec;
  size_t local_e8;
  char *local_e0;
  char *local_d8;
  int local_cc;
  char *local_c8;
  char *local_c0;
  ShellCommand *local_b8;
  int local_ac;
  char *local_a8;
  char *local_a0;
  ShellCommand *local_98;
  int local_8c;
  char *local_88;
  char *local_80;
  ShellCommand *local_78;
  int local_6c;
  char *local_68;
  char *local_60;
  ShellCommand *local_58;
  int local_4c;
  char *local_48;
  char *local_40;
  ShellCommand *local_38;
  int local_2c;
  char *local_28;
  char *local_20;
  ShellCommand *local_18;
  int local_c;
  
  value_local.Data = (char *)value.Length;
  this_local = (ShellCommand *)value.Data;
  sVar8 = name.Length;
  local_b50 = name.Data;
  local_b60 = "args";
  local_b48 = sVar8;
  local_b40 = ctx;
  ctx_local = (ConfigureContext *)this;
  value_local.Length = (size_t)local_b50;
  local_730 = strlen("args");
  local_718 = local_b50;
  local_710 = local_b48;
  local_728 = local_b60;
  local_738 = local_b60;
  local_3d0 = local_b60;
  local_3d8 = &local_718;
  local_2119 = false;
  local_720 = local_730;
  local_3c8 = local_730;
  if (local_b48 == local_730) {
    local_d8 = local_b50;
    local_e0 = local_b60;
    local_e8 = local_730;
    if (local_730 == 0) {
      local_cc = 0;
    }
    else {
      local_cc = memcmp(local_b50,local_b60,local_730);
    }
    local_2119 = local_cc == 0;
  }
  if (local_2119) {
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::clear(&this->args);
    pBVar5 = ConfigureContext::getDelegate(local_b40);
    local_b80 = std::__cxx11::string::data();
    uVar6 = std::__cxx11::string::length();
    iVar4 = (*pBVar5->_vptr_BuildFileDelegate[2])(pBVar5,local_b80,uVar6);
    local_b70.Data = (char *)CONCAT44(extraout_var,iVar4);
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
              (&this->args,&local_b70);
    pBVar5 = ConfigureContext::getDelegate(local_b40);
    local_ba0 = "-c";
    sVar7 = strlen("-c");
    iVar4 = (*pBVar5->_vptr_BuildFileDelegate[2])(pBVar5,local_ba0,sVar7);
    local_b90.Data = (char *)CONCAT44(extraout_var_00,iVar4);
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
              (&this->args,&local_b90);
    pBVar5 = ConfigureContext::getDelegate(local_b40);
    local_bc0 = this_local;
    local_bb8 = value_local.Data;
    iVar4 = (*pBVar5->_vptr_BuildFileDelegate[2])(pBVar5,this_local,value_local.Data);
    local_bb0.Data = (char *)CONCAT44(extraout_var_01,iVar4);
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
              (&this->args,&local_bb0);
  }
  else {
    local_bd0 = (void *)value_local.Length;
    local_be0 = "signature";
    local_bc8 = sVar8;
    local_760 = strlen("signature");
    local_748 = local_bd0;
    local_740 = local_bc8;
    local_758 = local_be0;
    local_768 = local_be0;
    local_3b8 = local_be0;
    local_3c0 = &local_748;
    bVar9 = false;
    local_750 = local_760;
    local_3b0 = local_760;
    if (local_bc8 == local_760) {
      local_f8 = local_bd0;
      local_100 = local_be0;
      local_108 = local_760;
      if (local_760 == 0) {
        local_ec = 0;
      }
      else {
        local_ec = memcmp(local_bd0,local_be0,local_760);
      }
      bVar9 = local_ec == 0;
    }
    if (bVar9) {
      llvm::StringRef::operator_cast_to_string(&local_c00,(StringRef *)&this_local);
      std::__cxx11::string::operator=((string *)&this->signatureData,(string *)&local_c00);
      std::__cxx11::string::~string((string *)&local_c00);
    }
    else {
      local_c10 = (void *)value_local.Length;
      local_c20 = "deps";
      local_c08 = sVar8;
      local_790 = strlen("deps");
      local_778 = local_c10;
      local_770 = local_c08;
      local_788 = local_c20;
      local_798 = local_c20;
      local_3a0 = local_c20;
      local_3a8 = &local_778;
      bVar9 = false;
      local_780 = local_790;
      local_398 = local_790;
      if (local_c08 == local_790) {
        local_118 = local_c10;
        local_120 = local_c20;
        local_128 = local_790;
        if (local_790 == 0) {
          local_10c = 0;
        }
        else {
          local_10c = memcmp(local_c10,local_c20,local_790);
        }
        bVar9 = local_10c == 0;
      }
      if (bVar9) {
        llvm::
        SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::clear(&(this->depsPaths).
                 super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               );
        llvm::SmallVectorImpl<std::__cxx11::string>::emplace_back<llvm::StringRef&>
                  ((SmallVectorImpl<std::__cxx11::string> *)&this->depsPaths,
                   (StringRef *)&this_local);
      }
      else {
        local_c30 = (void *)value_local.Length;
        local_c40 = "deps-style";
        local_c28 = sVar8;
        local_7c0 = strlen("deps-style");
        local_7a8 = local_c30;
        local_7a0 = local_c28;
        local_7b8 = local_c40;
        local_7c8 = local_c40;
        local_388 = local_c40;
        local_390 = &local_7a8;
        bVar9 = false;
        local_7b0 = local_7c0;
        local_380 = local_7c0;
        if (local_c28 == local_7c0) {
          local_138 = local_c30;
          local_140 = local_c40;
          local_148 = local_7c0;
          if (local_7c0 == 0) {
            local_12c = 0;
          }
          else {
            local_12c = memcmp(local_c30,local_c40,local_7c0);
          }
          bVar9 = local_12c == 0;
        }
        if (bVar9) {
          local_c50 = this_local;
          local_c48 = value_local.Data;
          local_c60 = "makefile";
          local_7f0 = (char *)strlen("makefile");
          local_7d8 = local_c50;
          local_7d0 = local_c48;
          local_7e8 = local_c60;
          local_7f8 = local_c60;
          local_370 = local_c60;
          local_378 = &local_7d8;
          bVar9 = false;
          local_7e0 = local_7f0;
          local_368 = local_7f0;
          if (local_c48 == local_7f0) {
            local_158 = local_c50;
            local_160 = local_c60;
            local_168 = local_7f0;
            if (local_7f0 == (char *)0x0) {
              local_14c = 0;
            }
            else {
              local_14c = memcmp(local_c50,local_c60,(size_t)local_7f0);
            }
            bVar9 = local_14c == 0;
          }
          if (bVar9) {
            this->depsStyle = Makefile;
          }
          else {
            local_c70 = this_local;
            local_c68 = value_local.Data;
            local_c80 = "dependency-info";
            local_820 = (char *)strlen("dependency-info");
            local_808 = local_c70;
            local_800 = local_c68;
            local_818 = local_c80;
            local_828 = local_c80;
            local_358 = local_c80;
            local_360 = &local_808;
            bVar9 = false;
            local_810 = local_820;
            local_350 = local_820;
            if (local_c68 == local_820) {
              local_178 = local_c70;
              local_180 = local_c80;
              local_188 = local_820;
              if (local_820 == (char *)0x0) {
                local_16c = 0;
              }
              else {
                local_16c = memcmp(local_c70,local_c80,(size_t)local_820);
              }
              bVar9 = local_16c == 0;
            }
            if (bVar9) {
              this->depsStyle = DependencyInfo;
            }
            else {
              local_c90 = this_local;
              local_c88 = value_local.Data;
              local_ca0 = "makefile-ignoring-subsequent-outputs";
              local_850 = (char *)strlen("makefile-ignoring-subsequent-outputs");
              local_838 = local_c90;
              local_830 = local_c88;
              local_848 = local_ca0;
              local_858 = local_ca0;
              local_340 = local_ca0;
              local_348 = &local_838;
              bVar9 = false;
              local_840 = local_850;
              local_338 = local_850;
              if (local_c88 == local_850) {
                local_198 = local_c90;
                local_1a0 = local_ca0;
                local_1a8 = local_850;
                if (local_850 == (char *)0x0) {
                  local_18c = 0;
                }
                else {
                  local_18c = memcmp(local_c90,local_ca0,(size_t)local_850);
                }
                bVar9 = local_18c == 0;
              }
              pCVar1 = local_b40;
              if (!bVar9) {
                llvm::operator+(&local_cd0,"unknown \'deps-style\': \'",(StringRef *)&this_local);
                llvm::Twine::Twine(&local_ce8,"\'");
                llvm::operator+(&local_cb8,&local_cd0,&local_ce8);
                ConfigureContext::error(pCVar1,&local_cb8);
                return false;
              }
              this->depsStyle = MakefileIgnoringSubsequentOutputs;
            }
          }
          return true;
        }
        local_cf8 = (void *)value_local.Length;
        local_d08 = "can-safely-interrupt";
        local_cf0 = sVar8;
        local_880 = strlen("can-safely-interrupt");
        local_868 = local_cf8;
        local_860 = local_cf0;
        local_878 = local_d08;
        local_888 = local_d08;
        local_328 = local_d08;
        local_330 = &local_868;
        bVar9 = false;
        local_870 = local_880;
        local_320 = local_880;
        if (local_cf0 == local_880) {
          local_1b8 = local_cf8;
          local_1c0 = local_d08;
          local_1c8 = local_880;
          if (local_880 == 0) {
            local_1ac = 0;
          }
          else {
            local_1ac = memcmp(local_cf8,local_d08,local_880);
          }
          bVar9 = local_1ac == 0;
        }
        if (bVar9) {
          local_d18 = this_local;
          local_d10 = value_local.Data;
          local_d28 = "true";
          local_4d0 = (char *)strlen("true");
          local_4a8 = local_d18;
          local_4a0 = local_d10;
          local_4b8 = local_d28;
          local_4c8 = local_d18;
          local_4c0 = local_d10;
          local_4d8 = local_d28;
          local_478 = local_d18;
          local_470 = local_d10;
          local_488 = local_d28;
          local_498 = local_d28;
          local_460 = local_d28;
          local_468 = &local_478;
          bVar9 = false;
          local_4b0 = local_4d0;
          local_490 = local_4d0;
          local_480 = local_4d0;
          local_458 = local_4d0;
          if (local_d10 == local_4d0) {
            local_18 = local_d18;
            local_20 = local_d28;
            local_28 = local_4d0;
            if (local_4d0 == (char *)0x0) {
              local_c = 0;
            }
            else {
              local_c = memcmp(local_d18,local_d28,(size_t)local_4d0);
            }
            bVar9 = local_c == 0;
          }
          bVar10 = false;
          if (!bVar9) {
            local_d38 = this_local;
            local_d30 = value_local.Data;
            local_d48 = "false";
            local_540 = (char *)strlen("false");
            local_518 = local_d38;
            local_510 = local_d30;
            local_528 = local_d48;
            local_538 = local_d38;
            local_530 = local_d30;
            local_548 = local_d48;
            local_4e8 = local_d38;
            local_4e0 = local_d30;
            local_4f8 = local_d48;
            local_508 = local_d48;
            local_448 = local_d48;
            local_450 = &local_4e8;
            bVar10 = false;
            local_520 = local_540;
            local_500 = local_540;
            local_4f0 = local_540;
            local_440 = local_540;
            if (local_d30 == local_540) {
              local_38 = local_d38;
              local_40 = local_d48;
              local_48 = local_540;
              if (local_540 == (char *)0x0) {
                local_2c = 0;
              }
              else {
                local_2c = memcmp(local_d38,local_d48,(size_t)local_540);
              }
              bVar10 = local_2c == 0;
            }
            bVar10 = (bool)(bVar10 ^ 1);
          }
          pCVar1 = local_b40;
          if (bVar10) {
            llvm::operator+(&local_da8,"invalid value: \'",(StringRef *)&this_local);
            llvm::Twine::Twine(&local_dc0,"\' for attribute \'");
            llvm::operator+(&local_d90,&local_da8,&local_dc0);
            llvm::Twine::Twine(&local_dd8,(StringRef *)&value_local.Length);
            llvm::operator+(&local_d78,&local_d90,&local_dd8);
            llvm::Twine::Twine(&local_df0,"\'");
            llvm::operator+(&local_d60,&local_d78,&local_df0);
            ConfigureContext::error(pCVar1,&local_d60);
            return false;
          }
          local_e00 = this_local;
          local_df8 = value_local.Data;
          local_e10 = "true";
          local_8b0 = (char *)strlen("true");
          local_898 = local_e00;
          local_890 = local_df8;
          local_8a8 = local_e10;
          local_8b8 = local_e10;
          local_310 = local_e10;
          local_318 = &local_898;
          local_22b1 = false;
          if (local_df8 == local_8b0) {
            local_1d8 = local_e00;
            local_1e0 = local_e10;
            if (local_8b0 == (char *)0x0) {
              local_1cc = 0;
            }
            else {
              local_8a0 = local_8b0;
              local_308 = local_8b0;
              local_1e8 = local_8b0;
              local_1cc = memcmp(local_e00,local_e10,(size_t)local_8b0);
            }
            local_22b1 = local_1cc == 0;
          }
          this->canSafelyInterrupt = local_22b1;
        }
        else {
          local_e20 = (void *)value_local.Length;
          local_e30 = "inherit-env";
          local_e18 = sVar8;
          local_8e0 = strlen("inherit-env");
          local_8c8 = local_e20;
          local_8c0 = local_e18;
          local_8d8 = local_e30;
          local_8e8 = local_e30;
          local_2f8 = local_e30;
          local_300 = &local_8c8;
          bVar9 = false;
          local_8d0 = local_8e0;
          local_2f0 = local_8e0;
          if (local_e18 == local_8e0) {
            local_1f8 = local_e20;
            local_200 = local_e30;
            local_208 = local_8e0;
            if (local_8e0 == 0) {
              local_1ec = 0;
            }
            else {
              local_1ec = memcmp(local_e20,local_e30,local_8e0);
            }
            bVar9 = local_1ec == 0;
          }
          __s1 = value_local.Length;
          if (bVar9) {
            local_e40 = this_local;
            local_e38 = value_local.Data;
            local_e50 = "true";
            local_5b0 = (char *)strlen("true");
            local_588 = local_e40;
            local_580 = local_e38;
            local_598 = local_e50;
            local_5a8 = local_e40;
            local_5a0 = local_e38;
            local_5b8 = local_e50;
            local_558 = local_e40;
            local_550 = local_e38;
            local_568 = local_e50;
            local_578 = local_e50;
            local_430 = local_e50;
            local_438 = &local_558;
            bVar9 = false;
            local_590 = local_5b0;
            local_570 = local_5b0;
            local_560 = local_5b0;
            local_428 = local_5b0;
            if (local_e38 == local_5b0) {
              local_58 = local_e40;
              local_60 = local_e50;
              local_68 = local_5b0;
              if (local_5b0 == (char *)0x0) {
                local_4c = 0;
              }
              else {
                local_4c = memcmp(local_e40,local_e50,(size_t)local_5b0);
              }
              bVar9 = local_4c == 0;
            }
            bVar10 = false;
            if (!bVar9) {
              local_e60 = this_local;
              local_e58 = value_local.Data;
              local_e70 = "false";
              local_620 = (char *)strlen("false");
              local_5f8 = local_e60;
              local_5f0 = local_e58;
              local_608 = local_e70;
              local_618 = local_e60;
              local_610 = local_e58;
              local_628 = local_e70;
              local_5c8 = local_e60;
              local_5c0 = local_e58;
              local_5d8 = local_e70;
              local_5e8 = local_e70;
              local_418 = local_e70;
              local_420 = &local_5c8;
              bVar10 = false;
              local_600 = local_620;
              local_5e0 = local_620;
              local_5d0 = local_620;
              local_410 = local_620;
              if (local_e58 == local_620) {
                local_78 = local_e60;
                local_80 = local_e70;
                local_88 = local_620;
                if (local_620 == (char *)0x0) {
                  local_6c = 0;
                }
                else {
                  local_6c = memcmp(local_e60,local_e70,(size_t)local_620);
                }
                bVar10 = local_6c == 0;
              }
              bVar10 = (bool)(bVar10 ^ 1);
            }
            pcVar3 = value_local.Data;
            pSVar2 = this_local;
            pCVar1 = local_b40;
            if (bVar10) {
              llvm::operator+(&local_ed0,"invalid value: \'",(StringRef *)&this_local);
              llvm::Twine::Twine(&local_ee8,"\' for attribute \'");
              llvm::operator+(&local_eb8,&local_ed0,&local_ee8);
              llvm::Twine::Twine(&local_f00,(StringRef *)&value_local.Length);
              llvm::operator+(&local_ea0,&local_eb8,&local_f00);
              llvm::Twine::Twine(&local_f18,"\'");
              llvm::operator+(&local_e88,&local_ea0,&local_f18);
              ConfigureContext::error(pCVar1,&local_e88);
              return false;
            }
            local_910 = (char *)strlen("true");
            local_8f8 = pSVar2;
            local_8f0 = pcVar3;
            local_908 = "true";
            local_918 = "true";
            local_2e0 = "true";
            local_2e8 = &local_8f8;
            local_2341 = false;
            if (pcVar3 == local_910) {
              local_218 = pSVar2;
              local_220 = "true";
              if (local_910 == (char *)0x0) {
                local_20c = 0;
              }
              else {
                local_900 = local_910;
                local_2d8 = local_910;
                local_228 = local_910;
                local_20c = memcmp(pSVar2,"true",(size_t)local_910);
              }
              local_2341 = local_20c == 0;
            }
            this->inheritEnv = local_2341;
          }
          else {
            wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts.
            _4088_8_ = anon_var_dwarf_1b54db;
            local_940 = strlen("working-directory");
            local_928 = __s1;
            local_938[0].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xff8].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_938[1].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xff9].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_938[2].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xffa].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_938[3].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xffb].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_938[4].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xffc].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_938[5].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xffd].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_938[6].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xffe].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_938[7].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xfff].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_948[0].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xff8].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_948[1].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xff9].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_948[2].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xffa].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_948[3].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xffb].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_948[4].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xffc].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_948[5].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xffd].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_948[6].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xffe].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_948[7].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xfff].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_2c8[0].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xff8].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_2c8[1].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xff9].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_2c8[2].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xffa].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_2c8[3].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xffb].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_2c8[4].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xffc].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_2c8[5].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xffd].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_2c8[6].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xffe].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_2c8[7].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                 wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
                 [0xfff].super_AlignedCharArray<1UL,_1UL>.buffer[0];
            local_2d0 = &local_928;
            bVar9 = false;
            local_930 = local_940;
            local_920 = sVar8;
            local_2c0 = local_940;
            if (sVar8 == local_940) {
              local_238 = __s1;
              local_240[0].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                   wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.
                   InlineElts[0xff8].super_AlignedCharArray<1UL,_1UL>.buffer[0];
              local_240[1].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                   wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.
                   InlineElts[0xff9].super_AlignedCharArray<1UL,_1UL>.buffer[0];
              local_240[2].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                   wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.
                   InlineElts[0xffa].super_AlignedCharArray<1UL,_1UL>.buffer[0];
              local_240[3].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                   wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.
                   InlineElts[0xffb].super_AlignedCharArray<1UL,_1UL>.buffer[0];
              local_240[4].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                   wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.
                   InlineElts[0xffc].super_AlignedCharArray<1UL,_1UL>.buffer[0];
              local_240[5].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                   wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.
                   InlineElts[0xffd].super_AlignedCharArray<1UL,_1UL>.buffer[0];
              local_240[6].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                   wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.
                   InlineElts[0xffe].super_AlignedCharArray<1UL,_1UL>.buffer[0];
              local_240[7].super_AlignedCharArray<1UL,_1UL>.buffer[0] =
                   wd.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.
                   InlineElts[0xfff].super_AlignedCharArray<1UL,_1UL>.buffer[0];
              local_248 = local_940;
              if (local_940 == 0) {
                local_22c = 0;
              }
              else {
                local_22c = memcmp((void *)__s1,
                                   (void *)wd.super_SmallVector<char,_4096U>.
                                           super_SmallVectorStorage<char,_4096U>.InlineElts._4088_8_
                                   ,local_940);
              }
              bVar9 = local_22c == 0;
            }
            if (bVar9) {
              local_1f78 = this_local;
              local_1f70 = value_local.Data;
              S.Length = (size_t)value_local.Data;
              S.Data = (char *)this_local;
              llvm::SmallString<4096U>::SmallString((SmallString<4096U> *)local_1f68,S);
              eVar11 = llvm::sys::fs::make_absolute((SmallVectorImpl<char> *)local_1f68);
              local_1f80 = eVar11._M_cat;
              local_1f88 = eVar11._M_value;
              local_1fb8 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_1f68);
              llvm::StringRef::operator_cast_to_string(&local_1fa8,&local_1fb8);
              std::__cxx11::string::operator=
                        ((string *)&this->workingDirectory,(string *)&local_1fa8);
              std::__cxx11::string::~string((string *)&local_1fa8);
              llvm::SmallString<4096U>::~SmallString((SmallString<4096U> *)local_1f68);
            }
            else {
              local_1fc8 = (void *)value_local.Length;
              local_1fd8 = "control-enabled";
              local_1fc0 = sVar8;
              local_970 = strlen("control-enabled");
              local_958 = local_1fc8;
              local_950 = local_1fc0;
              local_968 = local_1fd8;
              local_978 = local_1fd8;
              local_2b0 = local_1fd8;
              local_2b8 = &local_958;
              bVar9 = false;
              local_960 = local_970;
              local_2a8 = local_970;
              if (local_1fc0 == local_970) {
                local_258 = local_1fc8;
                local_260 = local_1fd8;
                local_268 = local_970;
                if (local_970 == 0) {
                  local_24c = 0;
                }
                else {
                  local_24c = memcmp(local_1fc8,local_1fd8,local_970);
                }
                bVar9 = local_24c == 0;
              }
              if (!bVar9) {
                name_00.Length = sVar8;
                name_00.Data = (char *)value_local.Length;
                value_00.Length = (size_t)value_local.Data;
                value_00.Data = (char *)this_local;
                bVar9 = ExternalCommand::configureAttribute
                                  (&this->super_ExternalCommand,local_b40,name_00,value_00);
                return bVar9;
              }
              local_1fe8 = this_local;
              local_1fe0 = value_local.Data;
              local_1ff8 = "true";
              local_690 = (char *)strlen("true");
              local_668 = local_1fe8;
              local_660 = local_1fe0;
              local_678 = local_1ff8;
              local_688 = local_1fe8;
              local_680 = local_1fe0;
              local_698 = local_1ff8;
              local_638 = local_1fe8;
              local_630 = local_1fe0;
              local_648 = local_1ff8;
              local_658 = local_1ff8;
              local_400 = local_1ff8;
              local_408 = &local_638;
              bVar9 = false;
              local_670 = local_690;
              local_650 = local_690;
              local_640 = local_690;
              local_3f8 = local_690;
              if (local_1fe0 == local_690) {
                local_98 = local_1fe8;
                local_a0 = local_1ff8;
                local_a8 = local_690;
                if (local_690 == (char *)0x0) {
                  local_8c = 0;
                }
                else {
                  local_8c = memcmp(local_1fe8,local_1ff8,(size_t)local_690);
                }
                bVar9 = local_8c == 0;
              }
              bVar10 = false;
              if (!bVar9) {
                local_2008 = this_local;
                local_2000 = value_local.Data;
                local_2018 = "false";
                local_700 = (char *)strlen("false");
                local_6d8 = local_2008;
                local_6d0 = local_2000;
                local_6e8 = local_2018;
                local_6f8 = local_2008;
                local_6f0 = local_2000;
                local_708 = local_2018;
                local_6a8 = local_2008;
                local_6a0 = local_2000;
                local_6b8 = local_2018;
                local_6c8 = local_2018;
                local_3e8 = local_2018;
                local_3f0 = &local_6a8;
                bVar10 = false;
                local_6e0 = local_700;
                local_6c0 = local_700;
                local_6b0 = local_700;
                local_3e0 = local_700;
                if (local_2000 == local_700) {
                  local_b8 = local_2008;
                  local_c0 = local_2018;
                  local_c8 = local_700;
                  if (local_700 == (char *)0x0) {
                    local_ac = 0;
                  }
                  else {
                    local_ac = memcmp(local_2008,local_2018,(size_t)local_700);
                  }
                  bVar10 = local_ac == 0;
                }
                bVar10 = (bool)(bVar10 ^ 1);
              }
              pcVar3 = value_local.Data;
              pSVar2 = this_local;
              pCVar1 = local_b40;
              if (bVar10) {
                llvm::operator+(&local_2078,"invalid value: \'",(StringRef *)&this_local);
                llvm::Twine::Twine(&local_2090,"\' for attribute \'");
                llvm::operator+(&local_2060,&local_2078,&local_2090);
                llvm::Twine::Twine(&local_20a8,(StringRef *)&value_local.Length);
                llvm::operator+(&local_2048,&local_2060,&local_20a8);
                llvm::Twine::Twine(&local_20c0,"\'");
                llvm::operator+(&local_2030,&local_2048,&local_20c0);
                ConfigureContext::error(pCVar1,&local_2030);
                return false;
              }
              local_290 = (char *)strlen("true");
              local_988 = pSVar2;
              local_980 = pcVar3;
              local_298 = "true";
              local_2a0 = &local_988;
              local_23f1 = false;
              if (pcVar3 == local_290) {
                local_278 = pSVar2;
                local_280 = "true";
                if (local_290 == (char *)0x0) {
                  local_26c = 0;
                }
                else {
                  local_288 = local_290;
                  local_26c = memcmp(pSVar2,"true",(size_t)local_290);
                }
                local_23f1 = local_26c == 0;
              }
              this->controlEnabled = local_23f1;
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool ShellCommand::configureAttribute(const ConfigureContext& ctx, StringRef name,
                                      StringRef value) {
  if (name == "args") {
    // When provided as a scalar string, we default to executing using the
    // shell.
    args.clear();
#if defined(_WIN32)
    args.push_back(ctx.getDelegate().getInternedString(
                       "C:\\windows\\system32\\cmd.exe"));
    args.push_back(ctx.getDelegate().getInternedString("/C"));
#else
    args.push_back(ctx.getDelegate().getInternedString(DefaultShellPath));
    args.push_back(ctx.getDelegate().getInternedString("-c"));
#endif
    args.push_back(ctx.getDelegate().getInternedString(value));
  } else if (name == "signature") {
    signatureData = value;
  } else if (name == "deps") {
    depsPaths.clear();
    depsPaths.emplace_back(value);
  } else if (name == "deps-style") {
    if (value == "makefile") {
      depsStyle = DepsStyle::Makefile;
    } else if (value == "dependency-info") {
      depsStyle = DepsStyle::DependencyInfo;
    } else if (value == "makefile-ignoring-subsequent-outputs") {
      depsStyle = DepsStyle::MakefileIgnoringSubsequentOutputs;
    } else {
      ctx.error("unknown 'deps-style': '" + value + "'");
      return false;
    }
    return true;
  } else if (name == "can-safely-interrupt") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    canSafelyInterrupt = value == "true";
  } else if (name == "inherit-env") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    inheritEnv = value == "true";
  } else if (name == "working-directory") {
    // Ensure the working directory is absolute. This will make sure any
    // relative directories are interpreted as relative to the CWD at the time
    // the rule is defined.
    SmallString<PATH_MAX> wd = value;
    llvm::sys::fs::make_absolute(wd);
    workingDirectory = StringRef(wd);
  } else if (name == "control-enabled") {
    if (value != "true" && value != "false") {
      ctx.error("invalid value: '" + value + "' for attribute '" +
                name + "'");
      return false;
    }
    controlEnabled = value == "true";
  } else {
    return ExternalCommand::configureAttribute(ctx, name, value);
  }

  return true;
}